

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

ScriptWitness * __thiscall
cfd::core::Transaction::SetScriptWitnessStack
          (ScriptWitness *__return_storage_ptr__,Transaction *this,uint32_t tx_in_index,
          uint32_t witness_index,ByteData *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ScriptWitness local_50;
  ScriptWitness *local_30;
  ScriptWitness *witness;
  ByteData *data_local;
  uint32_t witness_index_local;
  uint32_t tx_in_index_local;
  Transaction *this_local;
  
  witness = (ScriptWitness *)data;
  data_local._0_4_ = witness_index;
  data_local._4_4_ = tx_in_index;
  _witness_index_local = this;
  this_local = (Transaction *)__return_storage_ptr__;
  ByteData::GetBytes(&local_68,data);
  SetScriptWitnessStack(&local_50,this,tx_in_index,witness_index,&local_68);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  local_30 = &local_50;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,8);
  ScriptWitness::ScriptWitness(__return_storage_ptr__,local_30);
  ScriptWitness::~ScriptWitness((ScriptWitness *)0x437245);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness Transaction::SetScriptWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index, const ByteData &data) {
  const ScriptWitness &witness =
      SetScriptWitnessStack(tx_in_index, witness_index, data.GetBytes());
  CallbackStateChange(kStateChangeUpdateSignTxIn);
  return witness;
}